

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_flags_encoder.c
# Opt level: O0

lzma_ret lzma_filter_flags_encode(lzma_filter *filter,uint8_t *out,size_t *out_pos,size_t out_size)

{
  lzma_ret ret__3;
  lzma_ret ret__2;
  lzma_ret ret__1;
  uint32_t props_size;
  lzma_ret ret_;
  size_t out_size_local;
  size_t *out_pos_local;
  uint8_t *out_local;
  lzma_filter *filter_local;
  
  if (filter->id < 0x4000000000000000) {
    _props_size = out_size;
    out_size_local = (size_t)out_pos;
    out_pos_local = (size_t *)out;
    out_local = (uint8_t *)filter;
    ret__1 = lzma_vli_encode(filter->id,(size_t *)0x0,out,out_pos,out_size);
    filter_local._4_4_ = ret__1;
    if (((ret__1 == LZMA_OK) &&
        (filter_local._4_4_ = lzma_properties_size(&ret__2,(lzma_filter *)out_local),
        filter_local._4_4_ == LZMA_OK)) &&
       (filter_local._4_4_ =
             lzma_vli_encode((ulong)ret__2,(size_t *)0x0,(uint8_t *)out_pos_local,
                             (size_t *)out_size_local,_props_size), filter_local._4_4_ == LZMA_OK))
    {
      if (_props_size - *(long *)out_size_local < (ulong)ret__2) {
        filter_local._4_4_ = LZMA_PROG_ERROR;
      }
      else {
        filter_local._4_4_ =
             lzma_properties_encode
                       ((lzma_filter *)out_local,
                        (uint8_t *)((long)out_pos_local + *(long *)out_size_local));
        if (filter_local._4_4_ == LZMA_OK) {
          *(ulong *)out_size_local = (ulong)ret__2 + *(long *)out_size_local;
          filter_local._4_4_ = LZMA_OK;
        }
      }
    }
  }
  else {
    filter_local._4_4_ = LZMA_PROG_ERROR;
  }
  return filter_local._4_4_;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_filter_flags_encode(const lzma_filter *filter,
		uint8_t *out, size_t *out_pos, size_t out_size)
{
	// Filter ID
	if (filter->id >= LZMA_FILTER_RESERVED_START)
		return LZMA_PROG_ERROR;

	return_if_error(lzma_vli_encode(filter->id, NULL,
			out, out_pos, out_size));

	// Size of Properties
	uint32_t props_size;
	return_if_error(lzma_properties_size(&props_size, filter));
	return_if_error(lzma_vli_encode(props_size, NULL,
			out, out_pos, out_size));

	// Filter Properties
	if (out_size - *out_pos < props_size)
		return LZMA_PROG_ERROR;

	return_if_error(lzma_properties_encode(filter, out + *out_pos));

	*out_pos += props_size;

	return LZMA_OK;
}